

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_activate(term *t)

{
  term *t_local;
  
  if (Term == t) {
    t_local._4_4_ = 1;
  }
  else {
    if (Term != (term *)0x0) {
      Term_xtra(L'\f',L'\0');
    }
    if ((t != (term *)0x0) && ((t->active_flag & 1U) == 0)) {
      if (t->init_hook != (_func_void_term_ptr *)0x0) {
        (*t->init_hook)(t);
      }
      t->active_flag = true;
      t->mapped_flag = true;
    }
    Term = t;
    if (t != (term *)0x0) {
      Term_xtra(L'\f',L'\x01');
    }
    t_local._4_4_ = 0;
  }
  return t_local._4_4_;
}

Assistant:

errr Term_activate(term *t)
{
	/* Hack -- already done */
	if (Term == t) return (1);

	/* Deactivate the old Term */
	if (Term) Term_xtra(TERM_XTRA_LEVEL, 0);

	/* Hack -- Call the special "init" hook */
	if (t && !t->active_flag) {
		/* Call the "init" hook */
		if (t->init_hook) (*t->init_hook)(t);

		/* Remember */
		t->active_flag = true;

		/* Assume mapped */
		t->mapped_flag = true;
	}

	/* Remember the Term */
	Term = t;

	/* Activate the new Term */
	if (Term) Term_xtra(TERM_XTRA_LEVEL, 1);

	/* Success */
	return (0);
}